

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

bool sf::priv::InputImpl::isMouseButtonPressed(Button button)

{
  undefined4 in_EDI;
  uint buttons;
  int gy;
  int gx;
  int wy;
  int wx;
  Window child;
  Window root;
  Display *display;
  Display *in_stack_ffffffffffffffc0;
  uint local_34;
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  undefined1 local_28 [4];
  undefined1 local_24 [4];
  undefined1 local_20 [8];
  undefined1 local_18 [8];
  Display *local_10;
  undefined4 local_8;
  bool local_1;
  
  local_8 = in_EDI;
  local_10 = OpenDisplay();
  local_34 = 0;
  XQueryPointer(local_10,*(undefined8 *)
                          (*(long *)(local_10 + 0xe8) + 0x10 +
                          (long)*(int *)(local_10 + 0xe0) * 0x80),local_18,local_20,local_2c,
                local_30,local_24,local_28,&local_34);
  CloseDisplay(in_stack_ffffffffffffffc0);
  switch(local_8) {
  case 0:
    local_1 = (local_34 & 0x100) != 0;
    break;
  case 1:
    local_1 = (local_34 & 0x400) != 0;
    break;
  case 2:
    local_1 = (local_34 & 0x200) != 0;
    break;
  case 3:
    local_1 = false;
    break;
  case 4:
    local_1 = false;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool InputImpl::isMouseButtonPressed(Mouse::Button button)
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    // we don't care about these but they are required
    ::Window root, child;
    int wx, wy;
    int gx, gy;

    unsigned int buttons = 0;
    XQueryPointer(display, DefaultRootWindow(display), &root, &child, &gx, &gy, &wx, &wy, &buttons);

    // Close the connection with the X server
    CloseDisplay(display);

    // Buttons 4 and 5 are the vertical wheel and 6 and 7 the horizontal wheel.
    // There is no mask for buttons 8 and 9, so checking the state of buttons
    // Mouse::XButton1 and Mouse::XButton2 is not supported.
    switch (button)
    {
        case Mouse::Left:     return buttons & Button1Mask;
        case Mouse::Right:    return buttons & Button3Mask;
        case Mouse::Middle:   return buttons & Button2Mask;
        case Mouse::XButton1: return false; // not supported by X
        case Mouse::XButton2: return false; // not supported by X
        default:              return false;
    }

    return false;
}